

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::PathDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,PathDeclarationSyntax *this,size_t index)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    goto LAB_0021f6b6;
  case 1:
    *(PathDescriptionSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         (this->desc).ptr;
    goto LAB_0021f6d8;
  case 2:
    uVar3._0_2_ = (this->equals).kind;
    uVar3._2_1_ = (this->equals).field_0x2;
    uVar3._3_1_ = (this->equals).numFlags;
    uVar4 = (this->equals).rawLen;
    uVar5 = *(undefined4 *)&(this->equals).info;
    uVar6 = *(undefined4 *)((long)&(this->equals).info + 4);
    break;
  case 3:
    uVar3._0_2_ = (this->openParen).kind;
    uVar3._2_1_ = (this->openParen).field_0x2;
    uVar3._3_1_ = (this->openParen).numFlags;
    uVar4 = (this->openParen).rawLen;
    uVar5 = *(undefined4 *)&(this->openParen).info;
    uVar6 = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 4:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->delays).super_SyntaxListBase;
LAB_0021f6b6:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
LAB_0021f6d8:
    _Var2 = '\x01';
    goto LAB_0021f6f1;
  case 5:
    uVar3._0_2_ = (this->closeParen).kind;
    uVar3._2_1_ = (this->closeParen).field_0x2;
    uVar3._3_1_ = (this->closeParen).numFlags;
    uVar4 = (this->closeParen).rawLen;
    uVar5 = *(undefined4 *)&(this->closeParen).info;
    uVar6 = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  case 6:
    uVar3._0_2_ = (this->semi).kind;
    uVar3._2_1_ = (this->semi).field_0x2;
    uVar3._3_1_ = (this->semi).numFlags;
    uVar4 = (this->semi).rawLen;
    uVar5 = *(undefined4 *)&(this->semi).info;
    uVar6 = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0021f6ef;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar6;
LAB_0021f6ef:
  _Var2 = '\0';
LAB_0021f6f1:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax PathDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return desc.get();
        case 2: return equals;
        case 3: return openParen;
        case 4: return &delays;
        case 5: return closeParen;
        case 6: return semi;
        default: return nullptr;
    }
}